

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

void __thiscall QAccessibleToolButton::doAction(QAccessibleToolButton *this,QString *actionName)

{
  bool bVar1;
  ToolButtonPopupMode TVar2;
  QToolButton *in_RSI;
  QAbstractButton *in_RDI;
  QAccessibleButton *unaff_retaddr;
  QString *in_stack_ffffffffffffffd8;
  QToolButton *rhs;
  undefined1 down;
  QToolButton *this_00;
  QAbstractButton *actionName_00;
  
  actionName_00 = in_RDI;
  QAccessibleWidget::widget((QAccessibleWidget *)0x7eec31);
  bVar1 = QWidget::isEnabled((QWidget *)0x7eec39);
  if (bVar1) {
    rhs = in_RSI;
    QAccessibleActionInterface::pressAction();
    bVar1 = ::operator==((QString *)in_RSI,in_stack_ffffffffffffffd8);
    if (bVar1) {
      QAccessibleButton::button((QAccessibleButton *)0x7eec6e);
      QAbstractButton::click(in_RDI);
    }
    else {
      this_00 = rhs;
      QAccessibleActionInterface::showMenuAction();
      down = (undefined1)((ulong)in_RDI >> 0x38);
      bVar1 = ::operator==((QString *)in_RSI,(QString *)rhs);
      if (bVar1) {
        toolButton((QAccessibleToolButton *)0x7eeca2);
        TVar2 = QToolButton::popupMode(in_RSI);
        if (TVar2 != InstantPopup) {
          toolButton((QAccessibleToolButton *)0x7eecb9);
          QAbstractButton::setDown(&this_00->super_QAbstractButton,(bool)down);
          toolButton((QAccessibleToolButton *)0x7eecd0);
          QToolButton::showMenu(in_RSI);
        }
      }
      else {
        QAccessibleButton::doAction(unaff_retaddr,(QString *)actionName_00);
      }
    }
  }
  return;
}

Assistant:

void QAccessibleToolButton::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == pressAction()) {
        button()->click();
    } else if (actionName == showMenuAction()) {
#if QT_CONFIG(menu)
        if (toolButton()->popupMode() != QToolButton::InstantPopup) {
            toolButton()->setDown(true);
            toolButton()->showMenu();
        }
#endif
    } else {
        QAccessibleButton::doAction(actionName);
    }

}